

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checksum.cc
# Opt level: O1

bool perform_integrity_check(uint8_t *buf,size_t buf_len,uint32_t checksum,crc_mode_e mode)

{
  uint32_t uVar1;
  
  uVar1 = crc32_8(buf,buf_len,0);
  return uVar1 == checksum;
}

Assistant:

bool perform_integrity_check(const uint8_t* buf,
                            size_t buf_len,
                            uint32_t checksum,
                            crc_mode_e mode) {
    bool success = false;
#ifdef _CRC32C
    if (mode == CRC_UNKNOWN || mode == CRC32C) {
        success = checksum == crc32c(buf, buf_len, 0);
        if (!success && mode == CRC_UNKNOWN) {
            success = checksum == crc32_8((void *)buf, buf_len, 0);
        }
    } else
#endif
    {
        success = checksum == crc32_8((void *)buf, buf_len, 0);
    }
    return success;
}